

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O2

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<5,_4,_2>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  float fVar1;
  int r;
  long lVar2;
  int c;
  long lVar3;
  undefined4 extraout_EDX;
  undefined4 extraout_var;
  VecAccess<float,_4,_3> *this;
  Matrix<float,_2,_4> retVal;
  Vector<float,_2> local_90;
  Vector<float,_4> local_88;
  VecAccess<float,_4,_3> local_78;
  MatrixCaseUtils local_54 [12];
  Matrix<float,_4,_2> local_48;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    local_88.m_data._0_8_ = *(undefined8 *)(evalCtx->coords).m_data;
    local_88.m_data._8_8_ = *(undefined8 *)((evalCtx->coords).m_data + 2);
  }
  else {
    tcu::Vector<float,_4>::Vector
              (&local_88,(Vector<float,_4> *)sr::(anonymous_namespace)::s_constInVec4);
  }
  if (in1Type == INPUTTYPE_DYNAMIC) {
    local_90.m_data = *(float (*) [2])(evalCtx->coords).m_data;
  }
  else {
    tcu::Vector<float,_2>::Vector
              (&local_90,(Vector<float,_2> *)(sr::(anonymous_namespace)::s_constInVec2 + 8));
  }
  this = &local_78;
  tcu::Matrix<float,_2,_4>::Matrix((Matrix<float,_2,_4> *)this);
  for (lVar2 = 0; lVar2 != 2; lVar2 = lVar2 + 1) {
    fVar1 = local_90.m_data[lVar2];
    for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
      this->m_index[lVar3 * 2 + -2] = (int)(local_88.m_data[lVar3] * fVar1);
    }
    this = (VecAccess<float,_4,_3> *)
           (((Vector<tcu::Vector<float,_2>,_4> *)&this->m_vector)->m_data[0].m_data + 1);
  }
  tcu::transpose<float,2,4>
            (&local_48,(tcu *)&local_78,(Matrix<float,_2,_4> *)CONCAT44(extraout_var,extraout_EDX));
  reduceToVec3(local_54,&local_48);
  local_78.m_vector = &evalCtx->color;
  local_78.m_index[0] = 0;
  local_78.m_index[1] = 1;
  local_78.m_index[2] = 2;
  tcu::VecAccess<float,_4,_3>::operator=(&local_78,(Vector<float,_3> *)local_54);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(outerProduct(in0, in1));
	}